

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiTable::~ImGuiTable(ImGuiTable *this)

{
  ImGui::MemFree(this->RawData);
  ImVector<ImGuiTableColumnSortSpecs>::~ImVector(&this->SortSpecsMulti);
  ImDrawListSplitter::~ImDrawListSplitter(&this->DrawSplitter);
  ImVector<char>::~ImVector(&(this->ColumnsNames).Buf);
  return;
}

Assistant:

IMGUI_API ~ImGuiTable()     { IM_FREE(RawData); }